

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

void __thiscall asl::String::alloc(String *this,int n)

{
  char *pcVar1;
  undefined8 *puVar2;
  int iVar3;
  
  if (n < 0x10) {
    this->_size = 0;
  }
  else {
    iVar3 = 0x13;
    if (0x13 < n) {
      iVar3 = n;
    }
    this->_size = iVar3 + 1U;
    pcVar1 = (char *)malloc((ulong)(iVar3 + 1U));
    (this->field_2)._str = pcVar1;
    if (pcVar1 == (char *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = dup2;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

void alloc(int n)
	{
		if (n < ASL_STR_SPACE)
			_size = 0;
		else
		{
			_size = max(++n, 20);
			_str = (char*)malloc(_size);
			if (!_str)
				ASL_BAD_ALLOC();
		}
	}